

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bhtree.cpp
# Opt level: O0

void __thiscall BHTree::updateForce(BHTree *this,shared_ptr<Body> *body)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  double d;
  double s;
  shared_ptr<Body> *body_local;
  BHTree *this_local;
  
  bVar1 = std::operator==(&this->body,(nullptr_t)0x0);
  if ((!bVar1) && (bVar1 = std::operator==(body,&this->body), !bVar1)) {
    bVar1 = isExternal(this);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          body);
      Body::addForce(peVar2,&this->body);
    }
    else {
      this_00 = std::__shared_ptr_access<Quad,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Quad,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           &this->quad);
      dVar4 = Quad::getLength(this_00);
      peVar2 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->body);
      dVar5 = Body::distanceTo(peVar2,body);
      if (this->THETA <= dVar4 / dVar5) {
        peVar3 = std::__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&this->firstQuad);
        updateForce(peVar3,body);
        peVar3 = std::__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&this->secondQuad);
        updateForce(peVar3,body);
        peVar3 = std::__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&this->thirdQuad);
        updateForce(peVar3,body);
        peVar3 = std::__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&this->fourthQuad);
        updateForce(peVar3,body);
      }
      else {
        peVar2 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            body);
        Body::addForce(peVar2,&this->body);
      }
    }
  }
  return;
}

Assistant:

void BHTree::updateForce(const std::shared_ptr<Body> &body) {
    if (this->body == nullptr || body == this->body) {
        return;
    }

    if (this->isExternal()) {
        body->addForce(this->body);
    } else {
        double s = this->quad->getLength();
        double d = this->body->distanceTo(body);

        if (s / d < THETA) {
            body->addForce(this->body);
        } else {
            this->firstQuad->updateForce(body);
            this->secondQuad->updateForce(body);
            this->thirdQuad->updateForce(body);
            this->fourthQuad->updateForce(body);
        }
    }
}